

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimPatAssignInputs(Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x56,"void Gia_ManSimPatAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  pVVar3 = p->vCis;
  if (vSimsIn->nSize != pVVar3->nSize * nWords) {
    __assert_fail("Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x57,"void Gia_ManSimPatAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Wrd_t *)"
                 );
  }
  if (0 < pVVar3->nSize) {
    lVar4 = (long)nWords;
    lVar5 = 0;
    lVar6 = 0;
    do {
      iVar1 = pVVar3->pArray[lVar5];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar1 == 0) {
        return;
      }
      uVar2 = iVar1 * nWords;
      if (((((int)uVar2 < 0) || (vSims->nSize <= (int)uVar2)) || (lVar6 < 0)) ||
         ((long)vSimsIn->nSize <= (lVar6 + lVar4) - lVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      lVar5 = lVar5 + 1;
      memcpy(vSims->pArray + uVar2,vSimsIn->pArray + lVar6,lVar4 * 8);
      pVVar3 = p->vCis;
      lVar6 = lVar6 + lVar4;
    } while (lVar5 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Gia_ManSimPatAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, Vec_Wrd_t * vSimsIn )
{
    int i, Id;
    assert( Vec_WrdSize(vSims)   == nWords * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
}